

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O0

DdNode * cuddAddApplyRecur(DdManager *dd,DD_AOP op,DdNode *f,DdNode *g)

{
  DdNode *op_00;
  DdManager *T_00;
  DdManager *E_00;
  DdManager *local_90;
  uint local_88;
  uint local_84;
  DD_CTFP cacheOp;
  uint index;
  uint gord;
  uint ford;
  DdNode *E;
  DdNode *T;
  DdNode *gvn;
  DdNode *gv;
  DdNode *fvn;
  DdNode *fv;
  DdNode *res;
  DdNode *g_local;
  DdNode *f_local;
  DD_AOP op_local;
  DdManager *dd_local;
  
  res = g;
  g_local = f;
  f_local = (DdNode *)op;
  op_local = (DD_AOP)dd;
  dd_local = (DdManager *)(*op)(dd,&g_local,&res);
  op_00 = f_local;
  if ((dd_local == (DdManager *)0x0) &&
     (dd_local = (DdManager *)cuddCacheLookup2((DdManager *)op_local,(DD_CTFP)f_local,g_local,res),
     dd_local == (DdManager *)0x0)) {
    if (g_local->index == 0x7fffffff) {
      local_84 = g_local->index;
    }
    else {
      local_84 = *(uint *)(*(long *)(op_local + 0x138) + (ulong)g_local->index * 4);
    }
    if (res->index == 0x7fffffff) {
      local_88 = res->index;
    }
    else {
      local_88 = *(uint *)(*(long *)(op_local + 0x138) + (ulong)res->index * 4);
    }
    if (local_88 < local_84) {
      cacheOp._4_4_ = res->index;
      gv = g_local;
      fvn = g_local;
    }
    else {
      cacheOp._4_4_ = g_local->index;
      fvn = (g_local->type).kids.T;
      gv = (g_local->type).kids.E;
    }
    if (local_84 < local_88) {
      T = res;
      gvn = res;
    }
    else {
      gvn = (res->type).kids.T;
      T = (res->type).kids.E;
    }
    T_00 = (DdManager *)cuddAddApplyRecur((DdManager *)op_local,(DD_AOP)f_local,fvn,gvn);
    if (T_00 == (DdManager *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + 1;
      E_00 = (DdManager *)cuddAddApplyRecur((DdManager *)op_local,(DD_AOP)f_local,gv,T);
      if (E_00 == (DdManager *)0x0) {
        Cudd_RecursiveDeref((DdManager *)op_local,(DdNode *)T_00);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + 1;
        local_90 = T_00;
        if (T_00 != E_00) {
          local_90 = (DdManager *)
                     cuddUniqueInter((DdManager *)op_local,cacheOp._4_4_,(DdNode *)T_00,
                                     (DdNode *)E_00);
        }
        if (local_90 == (DdManager *)0x0) {
          Cudd_RecursiveDeref((DdManager *)op_local,(DdNode *)T_00);
          Cudd_RecursiveDeref((DdManager *)op_local,(DdNode *)E_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + -1;
          *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + -1;
          cuddCacheInsert2((DdManager *)op_local,(DD_CTFP)op_00,g_local,res,&local_90->sentinel);
          dd_local = local_90;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddAddApplyRecur(
  DdManager * dd,
  DD_AOP op,
  DdNode * f,
  DdNode * g)
{
    DdNode *res,
           *fv, *fvn, *gv, *gvn,
           *T, *E;
    unsigned int ford, gord;
    unsigned int index;
    DD_CTFP cacheOp;

    /* Check terminal cases. Op may swap f and g to increase the
     * cache hit rate.
     */
    statLine(dd);
    res = (*op)(dd,&f,&g);
    if (res != NULL) return(res);

    /* Check cache. */
    cacheOp = (DD_CTFP) op;
    res = cuddCacheLookup2(dd,cacheOp,f,g);
    if (res != NULL) return(res);

    /* Recursive step. */
    ford = cuddI(dd,f->index);
    gord = cuddI(dd,g->index);
    if (ford <= gord) {
        index = f->index;
        fv = cuddT(f);
        fvn = cuddE(f);
    } else {
        index = g->index;
        fv = fvn = f;
    }
    if (gord <= ford) {
        gv = cuddT(g);
        gvn = cuddE(g);
    } else {
        gv = gvn = g;
    }

    T = cuddAddApplyRecur(dd,op,fv,gv);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = cuddAddApplyRecur(dd,op,fvn,gvn);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);

    res = (T == E) ? T : cuddUniqueInter(dd,(int)index,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, T);
        Cudd_RecursiveDeref(dd, E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert2(dd,cacheOp,f,g,res);

    return(res);

}